

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::ConsoleAssertionPrinter::printMessage(ConsoleAssertionPrinter *this)

{
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *this_00;
  bool bVar1;
  ostream *poVar2;
  Column *col;
  StringRef str;
  Column local_78;
  reference local_40;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ConsoleAssertionPrinter *this_local;
  
  bVar1 = StringRef::empty(&this->messageLabel);
  if (!bVar1) {
    poVar2 = (ostream *)(this->messageLabel).m_start;
    str.m_size = (size_type)poVar2;
    str.m_start = (char *)(this->messageLabel).m_size;
    poVar2 = Catch::operator<<((Catch *)this->stream,poVar2,str);
    poVar2 = std::operator<<(poVar2,':');
    std::operator<<(poVar2,'\n');
  }
  this_00 = this->messages;
  __end2 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin(this_00);
  msg = (MessageInfo *)
        std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                *)&msg);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator*(&__end2);
    if (((this->printInfoMessages & 1U) != 0) || (local_40->type != Info)) {
      poVar2 = this->stream;
      TextFlow::Column::Column(&local_78,&local_40->message);
      col = TextFlow::Column::indent(&local_78,2);
      poVar2 = TextFlow::operator<<(poVar2,col);
      std::operator<<(poVar2,'\n');
      TextFlow::Column::~Column(&local_78);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void printMessage() const {
        if (!messageLabel.empty())
            stream << messageLabel << ':' << '\n';
        for (auto const& msg : messages) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || msg.type != ResultWas::Info)
                stream << TextFlow::Column(msg.message).indent(2) << '\n';
        }
    }